

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O0

void HTS_fclose(HTS_File *fp)

{
  char *in_RDI;
  HTS_Data *d;
  
  if (in_RDI != (char *)0x0) {
    if (*in_RDI == '\0') {
      if (*(long *)(in_RDI + 8) != 0) {
        fclose(*(FILE **)(in_RDI + 8));
      }
      HTS_free((void *)0x1054b7);
    }
    else if (*in_RDI == '\x01') {
      if (*(long *)(in_RDI + 8) != 0) {
        if (**(long **)(in_RDI + 8) != 0) {
          HTS_free((void *)0x1054f8);
        }
        HTS_free((void *)0x105502);
      }
      HTS_free((void *)0x10550c);
    }
    else {
      HTS_error(0,"HTS_fclose: Unknown file type.\n");
    }
  }
  return;
}

Assistant:

void HTS_fclose(HTS_File * fp)
{
   if (fp == NULL) {
      return;
   } else if (fp->type == HTS_FILE) {
      if (fp->pointer != NULL)
         fclose((FILE *) fp->pointer);
      HTS_free(fp);
      return;
   } else if (fp->type == HTS_DATA) {
      if (fp->pointer != NULL) {
         HTS_Data *d = (HTS_Data *) fp->pointer;
         if (d->data != NULL)
            HTS_free(d->data);
         HTS_free(d);
      }
      HTS_free(fp);
      return;
   }
   HTS_error(0, "HTS_fclose: Unknown file type.\n");
}